

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linecurve.cpp
# Opt level: O0

bool __thiscall ON_LineCurve::IsInPlane(ON_LineCurve *this,ON_Plane *plane,double tolerance)

{
  double dVar1;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  double local_30;
  double d;
  double dStack_20;
  bool rc;
  double tolerance_local;
  ON_Plane *plane_local;
  ON_LineCurve *this_local;
  
  d._7_1_ = 0;
  dStack_20 = tolerance;
  tolerance_local = (double)plane;
  plane_local = (ON_Plane *)this;
  ON_Curve::PointAtStart(&local_48,&this->super_ON_Curve);
  local_30 = ON_Plane::DistanceTo(plane,&local_48);
  dVar1 = tolerance_local;
  local_30 = ABS(local_30);
  if (local_30 <= dStack_20) {
    ON_Curve::PointAtEnd(&local_60,&this->super_ON_Curve);
    dVar1 = ON_Plane::DistanceTo((ON_Plane *)dVar1,&local_60);
    if (ABS(dVar1) <= dStack_20) {
      d._7_1_ = 1;
    }
  }
  return (bool)(d._7_1_ & 1);
}

Assistant:

bool
ON_LineCurve::IsInPlane(
      const ON_Plane& plane, // plane to test
      double tolerance // tolerance to use when checking linearity
      ) const
{
  bool rc = false;
  double d = fabs( plane.DistanceTo( PointAtStart() ));
  if ( d <= tolerance ) {
    d = fabs( plane.DistanceTo( PointAtEnd() ));
    if ( d <= tolerance )
      rc = true;
  }
  return rc;
}